

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::anon_unknown_3::SymbolProperties::SetFunction(SymbolProperties *this,char *function)

{
  size_t sVar1;
  char *pcVar2;
  long *local_48;
  char *local_40;
  long local_38 [2];
  
  pcVar2 = "???";
  if (function != (char *)0x0) {
    pcVar2 = function;
  }
  local_48 = local_38;
  sVar1 = strlen(pcVar2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar2,pcVar2 + sVar1);
  pcVar2 = (char *)__cxa_demangle(function,0,0);
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&local_48,0,local_40,(ulong)pcVar2);
  free(pcVar2);
  std::__cxx11::string::operator=((string *)&this->Function,(string *)&local_48);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void SetFunction(const char* function)
  {
    this->Function = this->Demangle(function);
  }